

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::BuildBrS(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  short sVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  OpLayoutBrS *pOVar6;
  IntConstOpnd *srcOpnd;
  BranchInstr *branchInstr_00;
  uint targetOffset;
  OpLayoutBrS *branchInsn;
  BranchInstr *branchInstr;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  bVar3 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1cdc,"(!OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "!OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pOVar6 = Js::ByteCodeReader::BrS(&this->m_jnReader);
  uVar4 = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
  sVar1 = pOVar6->RelativeJumpOffset;
  srcOpnd = IR::IntConstOpnd::New((ulong)pOVar6->val,TyInt32,this->m_func,false);
  branchInstr_00 =
       IR::BranchInstr::New(newOpcode,(LabelInstr *)0x0,&srcOpnd->super_Opnd,this->m_func);
  AddBranchInstr(this,branchInstr_00,offset,uVar4 + (int)sVar1);
  return;
}

Assistant:

void
IRBuilder::BuildBrS(Js::OpCode newOpcode, uint32 offset)
{
    Assert(!OpCodeAttr::HasMultiSizeLayout(newOpcode));

    IR::BranchInstr * branchInstr;
    const unaligned   Js::OpLayoutBrS *branchInsn = m_jnReader.BrS();

    unsigned int      targetOffset = m_jnReader.GetCurrentOffset() + branchInsn->RelativeJumpOffset;

    branchInstr = IR::BranchInstr::New(newOpcode, nullptr,
        IR::IntConstOpnd::New(branchInsn->val,
        TyInt32, m_func),m_func);
    this->AddBranchInstr(branchInstr, offset, targetOffset);
}